

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int ffgmng(fitsfile *mfptr,long *ngroups,int *status)

{
  int iVar1;
  bool bVar2;
  char *local_1a0;
  char *tkeyvalue;
  char comment [73];
  char card [81];
  char local_e8 [8];
  char newKeyword [75];
  char keyword [75];
  char *inclist [1];
  long grpid;
  int i;
  int newIndex;
  int index;
  int offset;
  int *status_local;
  long *ngroups_local;
  fitsfile *mfptr_local;
  
  stack0xffffffffffffffb8 = "GRPID#";
  if (*status == 0) {
    *ngroups = 0;
    iVar1 = ffgrec(mfptr,0,comment + 0x48,status);
    *status = iVar1;
    while (*status == 0) {
      iVar1 = ffgnxk(mfptr,(char **)(keyword + 0x48),1,(char **)0x0,0,comment + 0x48,status);
      *status = iVar1;
      if (*status == 0) {
        *ngroups = *ngroups + 1;
      }
    }
    if (*status == 0xca) {
      *status = 0;
    }
    i = 1;
    newIndex = 0;
    grpid._0_4_ = 1;
    while( true ) {
      bVar2 = false;
      if ((long)(int)grpid <= *ngroups) {
        bVar2 = *status == 0;
      }
      if (!bVar2) break;
      snprintf(newKeyword + 0x48,0x4b,"GRPID%d",(ulong)(uint)i);
      iVar1 = ffgkyj(mfptr,newKeyword + 0x48,(long *)inclist,comment + 0x48,status);
      *status = iVar1;
      if (*status == 0xca) {
        *status = 0;
        newIndex = newIndex + 1;
      }
      else {
        grpid._0_4_ = (int)grpid + 1;
        if (0 < newIndex) {
          snprintf(local_e8,0x4b,"GRPID%d",(ulong)(uint)(i - newIndex));
          ffmnam(mfptr,newKeyword + 0x48,local_e8,status);
          snprintf(newKeyword + 0x48,0x4b,"GRPLC%d",(ulong)(uint)i);
          snprintf(local_e8,0x4b,"GRPLC%d",(ulong)(uint)(i - newIndex));
          iVar1 = ffgkls(mfptr,newKeyword + 0x48,&local_1a0,(char *)&tkeyvalue,status);
          *status = iVar1;
          if (*status == 0) {
            ffdkey(mfptr,newKeyword + 0x48,status);
            ffikls(mfptr,local_e8,local_1a0,(char *)&tkeyvalue,status);
            ffplsw(mfptr,status);
            free(local_1a0);
          }
          if (*status == 0xca) {
            *status = 0;
          }
        }
      }
      i = i + 1;
    }
    mfptr_local._4_4_ = *status;
  }
  else {
    mfptr_local._4_4_ = *status;
  }
  return mfptr_local._4_4_;
}

Assistant:

int ffgmng(fitsfile *mfptr,   /* FITS file pointer to member HDU            */
	   long     *ngroups, /* total number of groups linked to HDU       */
	   int      *status)  /* return status code                         */

/*
  return the number of groups to which a HDU belongs, as defined by the number
  of GRPIDn/GRPLCn keyword records that appear in the HDU header. The 
  fitsfile pointer mfptr must be positioned with the member HDU as the CHDU. 
  Each time this function is called, the indicies of the GRPIDn/GRPLCn
  keywords are checked to make sure they are continuous (ie no gaps) and
  are re-enumerated to eliminate gaps if gaps are found to be present.
*/

{
  int offset;
  int index;
  int newIndex;
  int i;
  
  long grpid;

  char *inclist[] = {"GRPID#"};
  char keyword[FLEN_KEYWORD];
  char newKeyword[FLEN_KEYWORD];
  char card[FLEN_CARD];
  char comment[FLEN_COMMENT];
  char *tkeyvalue;

  if(*status != 0) return(*status);

  *ngroups = 0;

  /* reset the member HDU keyword counter to the beginning */

  *status = ffgrec(mfptr,0,card,status);
  
  /*
    search for the number of GRPIDn keywords in the member HDU header
    and count them with the ngroups variable
  */
  
  while(*status == 0)
    {
      /* read the next GRPIDn keyword in the series */

      *status = fits_find_nextkey(mfptr,inclist,1,NULL,0,card,status);
      
      if(*status != 0) continue;
      
      ++(*ngroups);
    }

  if(*status == KEY_NO_EXIST) *status = 0;
      
  /*
     read each GRPIDn/GRPLCn keyword and adjust their index values so that
     there are no gaps in the index count
  */

  for(index = 1, offset = 0, i = 1; i <= *ngroups && *status == 0; ++index)
    {	  
      snprintf(keyword,FLEN_KEYWORD,"GRPID%d",index);

      /* try to read the next GRPIDn keyword in the series */

      *status = fits_read_key_lng(mfptr,keyword,&grpid,card,status);

      /* if not found then increment the offset counter and continue */

      if(*status == KEY_NO_EXIST) 
	{
	  *status = 0;
	  ++offset;
	}
      else
	{
	  /* 
	     increment the number_keys_found counter and see if the index
	     of the keyword needs to be updated
	  */

	  ++i;

	  if(offset > 0)
	    {
	      /* compute the new index for the GRPIDn/GRPLCn keywords */
	      newIndex = index - offset;

	      /* update the GRPIDn keyword index */

	      snprintf(newKeyword,FLEN_KEYWORD,"GRPID%d",newIndex);
	      fits_modify_name(mfptr,keyword,newKeyword,status);

	      /* If present, update the GRPLCn keyword index */

	      snprintf(keyword,FLEN_KEYWORD,"GRPLC%d",index);
	      snprintf(newKeyword,FLEN_KEYWORD,"GRPLC%d",newIndex);
	      /* SPR 1738 */
	      *status = fits_read_key_longstr(mfptr,keyword,&tkeyvalue,comment,
					      status);
	      if (0 == *status) {
		fits_delete_key(mfptr,keyword,status);
		fits_insert_key_longstr(mfptr,newKeyword,tkeyvalue,comment,status);
		fits_write_key_longwarn(mfptr,status);
		free(tkeyvalue);
	      }
	      

	      if(*status == KEY_NO_EXIST) *status = 0;
	    }
	}
    }

  return(*status);
}